

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O2

const_iterator pstore::command_line::option::add_to_global_list(option *opt)

{
  _List_iterator<pstore::command_line::option_*> _Var1;
  option *opt_local;
  
  opt_local = opt;
  all_abi_cxx11_();
  std::__cxx11::
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::push_back
            (&all[abi:cxx11]()::all_options_abi_cxx11_,&opt_local);
  _Var1 = std::prev<std::_List_iterator<pstore::command_line::option*>>
                    ((_List_iterator<pstore::command_line::option_*>)0x1696d0,1);
  return (const_iterator)_Var1._M_node;
}

Assistant:

auto option::add_to_global_list (option * const opt)
                -> options_container::const_iterator {
                options_container & all = option::all ();
                all.push_back (opt);
                return std::prev (all.end ());
            }